

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteMessageTests::TestsetStringWithHeaderGroup::~TestsetStringWithHeaderGroup
          (TestsetStringWithHeaderGroup *this)

{
  TestsetStringWithHeaderGroup *this_local;
  
  ~TestsetStringWithHeaderGroup(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(setStringWithHeaderGroup)
{
  FIX::Message object;
  DataDictionary dataDictionary( "../spec/FIX43.xml" );
  static const char* str =
    "8=FIX.4.3\0019=152\00135=A\00134=125\00149=BUYSIDE\001"
    "52=20040916-16:19:18.328\00156=SELLSIDE\001"
    "627=2\001628=HOP1\001629=20040916-16:19:18.328\001630=ID1\001"
    "628=HOP2\001629=20040916-16:19:18.328\001630=ID2\001"
    "10=079\001";

  object.setString( str, true, &dataDictionary );
  CHECK_EQUAL( str, object.toString() );
}